

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embed.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeEmbed(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Rep *pRVar4;
  string *psVar5;
  bool bVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  Type *pTVar11;
  Type *pTVar12;
  Type *pTVar13;
  EmbedParameter *pEVar14;
  LogMessage *pLVar15;
  undefined8 *puVar16;
  long *plVar17;
  LayerUnion LVar18;
  WeightParams *pWVar19;
  float *pfVar20;
  uint uVar21;
  long *plVar22;
  ulong *puVar23;
  size_type *psVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 uVar29;
  void **ppvVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str;
  string __str_1;
  string __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  LogFinisher local_1a1;
  string local_1a0;
  undefined1 local_180 [56];
  ulong *local_148;
  long local_140;
  ulong local_138;
  undefined8 uStack_130;
  Type *local_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  ulong *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  ulong local_f0 [2];
  ulong local_e0;
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong local_98;
  Type *local_90;
  Type *local_88;
  ulong local_80;
  int local_74;
  LayerUnion local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar10 = getLayerIndex(pTVar11,in_stack_00000030);
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar10);
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  if (((pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     (iVar10 = 1, (pTVar11->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_180,(pTVar11->name_).ptr_,(pTVar11->type_).ptr_);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    iVar10 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (pTVar11->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar30 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar30 = (void **)0x0;
  }
  local_128 = pTVar11;
  local_90 = pTVar12;
  local_88 = pTVar13;
  if (iVar10 != 0) {
    lVar32 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_48,*(value_type **)((long)ppvVar30 + lVar32));
      lVar32 = lVar32 + 8;
    } while ((long)iVar10 * 8 != lVar32);
  }
  pRVar4 = (local_128->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar30 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar30 = (void **)0x0;
  }
  lVar32 = (long)(local_128->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar32 != 0) {
    lVar33 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_68,*(value_type **)((long)ppvVar30 + lVar33));
      lVar33 = lVar33 + 8;
    } while (lVar32 * 8 != lVar33);
  }
  pTVar11 = local_128;
  convertCaffeMetadata
            ((local_128->name_).ptr_,&local_48,&local_68,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pTVar12 = local_90;
  pEVar14 = pTVar11->embed_param_;
  if (pEVar14 == (EmbedParameter *)0x0) {
    pEVar14 = (EmbedParameter *)&caffe::_EmbedParameter_default_instance_;
  }
  uVar36 = pEVar14->num_output_;
  uVar28 = (ulong)uVar36;
  uVar27 = (ulong)pEVar14->input_dim_;
  bVar3 = pEVar14->bias_term_;
  iVar10 = (local_90->blobs_).super_RepeatedPtrFieldBase.current_size_;
  local_e0 = uVar27;
  if (iVar10 < 2) {
    uVar25 = 0;
    if (iVar10 == 0) {
      local_180._0_8_ = local_180 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Weight blobs not provided","");
      psVar5 = (local_128->name_).ptr_;
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Embed","");
      errorInCaffeProto((string *)local_180,psVar5,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      uVar27 = local_e0;
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
        uVar25 = 0;
      }
    }
  }
  else {
    uVar25 = (ulong)*(uint *)(*(long *)((local_90->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) +
                             0x18);
  }
  if (((int)uVar25 == 0) && (bVar3 != false)) {
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,
               "Expected bias parameters when \'bias_term\' flag is set to True.","");
    psVar5 = (local_128->name_).ptr_;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Embed","");
    errorInCaffeProto((string *)local_180,psVar5,&local_1a0);
LAB_003ce88d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    uVar27 = local_e0;
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  else if ((0 < (int)uVar25) && (bVar3 == false)) {
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"Found bias parameters even though \'bias_term\' flag is False",
               "");
    psVar5 = (local_128->name_).ptr_;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Embed","");
    errorInCaffeProto((string *)local_180,psVar5,&local_1a0);
    goto LAB_003ce88d;
  }
  if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) != 2) {
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,"Weight blob dim size is not 2","");
    psVar5 = (local_128->name_).ptr_;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Embed","");
    errorInCaffeProto((string *)local_180,psVar5,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    uVar27 = local_e0;
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  local_98 = uVar28;
  local_80 = uVar25;
  if (*(ulong *)(puVar16[4] + 0x10) != uVar28) {
    cVar9 = '\x01';
    if (9 < uVar36) {
      uVar31 = uVar36;
      cVar8 = '\x04';
      do {
        cVar9 = cVar8;
        if (uVar31 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_003ceae5;
        }
        if (uVar31 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_003ceae5;
        }
        if (uVar31 < 10000) goto LAB_003ceae5;
        bVar6 = 99999 < uVar31;
        uVar31 = uVar31 / 10000;
        cVar8 = cVar9 + '\x04';
      } while (bVar6);
      cVar9 = cVar9 + '\x01';
    }
LAB_003ceae5:
    local_100 = local_f0;
    std::__cxx11::string::_M_construct((ulong)&local_100,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100,local_f8,uVar36);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x5e44a9);
    local_b8 = &local_a8;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_a8 = *plVar22;
      lStack_a0 = plVar17[3];
    }
    else {
      local_a8 = *plVar22;
      local_b8 = (long *)*plVar17;
    }
    local_b0 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_b8);
    puVar23 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar23) {
      local_110 = *puVar23;
      lStack_108 = plVar17[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *puVar23;
      local_120 = (ulong *)*plVar17;
    }
    local_118 = plVar17[1];
    *plVar17 = (long)puVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_1a1,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
    }
    puVar16 = *(undefined8 **)
               ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar16 == (undefined8 *)0x0) {
      puVar16 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar16 + 3) < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_1a1,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
    }
    uVar27 = *(ulong *)(puVar16[4] + 0x10);
    uVar28 = -uVar27;
    if (0 < (long)uVar27) {
      uVar28 = uVar27;
    }
    uVar36 = 1;
    if (9 < uVar28) {
      uVar25 = uVar28;
      uVar31 = 4;
      do {
        uVar36 = uVar31;
        if (uVar25 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_003ced05;
        }
        if (uVar25 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_003ced05;
        }
        if (uVar25 < 10000) goto LAB_003ced05;
        bVar6 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        uVar31 = uVar36 + 4;
      } while (bVar6);
      uVar36 = uVar36 + 1;
    }
LAB_003ced05:
    paVar2 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar36 - (char)((long)uVar27 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p + -((long)uVar27 >> 0x3f),uVar36,uVar28);
    uVar27 = 0xf;
    if (local_120 != &local_110) {
      uVar27 = local_110;
    }
    if (uVar27 < local_d8._M_string_length + local_118) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        uVar29 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_d8._M_string_length + local_118) goto LAB_003ced93;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_120);
    }
    else {
LAB_003ced93:
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_d8._M_dataplus._M_p)
      ;
    }
    local_148 = &local_138;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_138 = *puVar23;
      uStack_130 = puVar16[3];
    }
    else {
      local_138 = *puVar23;
      local_148 = (ulong *)*puVar16;
    }
    local_140 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)puVar23 = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    psVar24 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0.field_2._8_8_ = puVar16[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_1a0._M_string_length = puVar16[1];
    *puVar16 = psVar24;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    psVar5 = (local_128->name_).ptr_;
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"Embed","");
    errorInCaffeProto(&local_1a0,psVar5,(string *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    uVar27 = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    uVar28 = local_98;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  if (*(ulong *)(puVar16[4] + 8) != uVar27) {
    cVar9 = '\x01';
    uVar36 = (uint)uVar27;
    if (9 < uVar36) {
      cVar8 = '\x04';
      do {
        cVar9 = cVar8;
        uVar31 = (uint)uVar27;
        if (uVar31 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_003cf07c;
        }
        if (uVar31 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_003cf07c;
        }
        if (uVar31 < 10000) goto LAB_003cf07c;
        uVar27 = (uVar27 & 0xffffffff) / 10000;
        cVar8 = cVar9 + '\x04';
      } while (99999 < uVar31);
      cVar9 = cVar9 + '\x01';
    }
LAB_003cf07c:
    local_100 = local_f0;
    std::__cxx11::string::_M_construct((ulong)&local_100,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100,local_f8,uVar36);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x5e44f1);
    local_b8 = &local_a8;
    plVar22 = plVar17 + 2;
    if ((long *)*plVar17 == plVar22) {
      local_a8 = *plVar22;
      lStack_a0 = plVar17[3];
    }
    else {
      local_a8 = *plVar22;
      local_b8 = (long *)*plVar17;
    }
    local_b0 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_b8);
    puVar23 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar23) {
      local_110 = *puVar23;
      lStack_108 = plVar17[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *puVar23;
      local_120 = (ulong *)*plVar17;
    }
    local_118 = plVar17[1];
    *plVar17 = (long)puVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_1a1,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
    }
    puVar16 = *(undefined8 **)
               ((long)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar16 == (undefined8 *)0x0) {
      puVar16 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar16 + 3) < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_1a1,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
    }
    uVar27 = *(ulong *)(puVar16[4] + 8);
    uVar28 = -uVar27;
    if (0 < (long)uVar27) {
      uVar28 = uVar27;
    }
    uVar36 = 1;
    if (9 < uVar28) {
      uVar25 = uVar28;
      uVar31 = 4;
      do {
        uVar36 = uVar31;
        if (uVar25 < 100) {
          uVar36 = uVar36 - 2;
          goto LAB_003cf29d;
        }
        if (uVar25 < 1000) {
          uVar36 = uVar36 - 1;
          goto LAB_003cf29d;
        }
        if (uVar25 < 10000) goto LAB_003cf29d;
        bVar6 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        uVar31 = uVar36 + 4;
      } while (bVar6);
      uVar36 = uVar36 + 1;
    }
LAB_003cf29d:
    paVar2 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar36 - (char)((long)uVar27 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d8._M_dataplus._M_p + -((long)uVar27 >> 0x3f),uVar36,uVar28);
    uVar27 = 0xf;
    if (local_120 != &local_110) {
      uVar27 = local_110;
    }
    if (uVar27 < local_d8._M_string_length + local_118) {
      uVar29 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        uVar29 = local_d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar29 < local_d8._M_string_length + local_118) goto LAB_003cf32b;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_120);
    }
    else {
LAB_003cf32b:
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_d8._M_dataplus._M_p)
      ;
    }
    local_148 = &local_138;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_138 = *puVar23;
      uStack_130 = puVar16[3];
    }
    else {
      local_138 = *puVar23;
      local_148 = (ulong *)*puVar16;
    }
    local_140 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)puVar23 = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
    psVar24 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0.field_2._8_8_ = puVar16[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_1a0._M_string_length = puVar16[1];
    *puVar16 = psVar24;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    psVar5 = (local_128->name_).ptr_;
    local_180._0_8_ = local_180 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"Embed","");
    errorInCaffeProto(&local_1a0,psVar5,(string *)local_180);
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    uVar27 = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    uVar28 = local_98;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  pTVar13 = local_88;
  if (local_88->_oneof_case_[0] == 0x96) {
    LVar18 = local_88->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_88);
    pTVar13->_oneof_case_[0] = 0x96;
    LVar18.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::EmbeddingLayerParams::EmbeddingLayerParams(LVar18.embedding_);
    (local_88->layer_).embedding_ = (EmbeddingLayerParams *)LVar18;
  }
  (LVar18.innerproduct_)->inputchannels_ = uVar27;
  (LVar18.innerproduct_)->outputchannels_ = uVar28;
  (LVar18.innerproduct_)->hasbias_ = bVar3;
  if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  uVar31 = (int)uVar28 * (int)uVar27;
  uVar36 = *(uint *)((long)((local_90->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18)
  ;
  if (((int)uVar36 < 0) || (uVar36 != uVar31)) {
    cVar9 = '\x01';
    if (9 < uVar31) {
      uVar26 = uVar31;
      cVar8 = '\x04';
      do {
        cVar9 = cVar8;
        if (uVar26 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_003cf634;
        }
        if (uVar26 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_003cf634;
        }
        if (uVar26 < 10000) goto LAB_003cf634;
        bVar6 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar8 = cVar9 + '\x04';
      } while (bVar6);
      cVar9 = cVar9 + '\x01';
    }
LAB_003cf634:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar31);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e4537);
    local_120 = &local_110;
    puVar23 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar23) {
      local_110 = *puVar23;
      lStack_108 = plVar17[3];
    }
    else {
      local_110 = *puVar23;
      local_120 = (ulong *)*plVar17;
    }
    local_118 = plVar17[1];
    *plVar17 = (long)puVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    local_148 = &local_138;
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_138 = *puVar23;
      uStack_130 = puVar16[3];
    }
    else {
      local_138 = *puVar23;
      local_148 = (ulong *)*puVar16;
    }
    local_140 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    uVar26 = -uVar36;
    if (0 < (int)uVar36) {
      uVar26 = uVar36;
    }
    uVar34 = 1;
    if (9 < uVar26) {
      uVar27 = (ulong)uVar26;
      uVar7 = 4;
      do {
        uVar34 = uVar7;
        uVar21 = (uint)uVar27;
        if (uVar21 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_003cf783;
        }
        if (uVar21 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_003cf783;
        }
        if (uVar21 < 10000) goto LAB_003cf783;
        uVar27 = uVar27 / 10000;
        uVar7 = uVar34 + 4;
      } while (99999 < uVar21);
      uVar34 = uVar34 + 1;
    }
LAB_003cf783:
    local_100 = local_f0;
    std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar34 - (char)((int)uVar36 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_100 + (ulong)(uVar36 >> 0x1f)),uVar34,uVar26);
    uVar27 = CONCAT44(uStack_f4,local_f8) + local_140;
    uVar28 = 0xf;
    if (local_148 != &local_138) {
      uVar28 = local_138;
    }
    if (uVar28 < uVar27) {
      uVar28 = 0xf;
      if (local_100 != local_f0) {
        uVar28 = local_f0[0];
      }
      if (uVar28 < uVar27) goto LAB_003cf80c;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_148);
    }
    else {
LAB_003cf80c:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_100);
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    psVar24 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0.field_2._8_8_ = puVar16[3];
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_1a0._M_string_length = puVar16[1];
    *puVar16 = psVar24;
    puVar16[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    psVar24 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar24) {
      local_180._16_8_ = *psVar24;
      local_180._24_4_ = (undefined4)plVar17[3];
      local_180._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_180._0_8_ = local_180 + 0x10;
    }
    else {
      local_180._16_8_ = *psVar24;
      local_180._0_8_ = (size_type *)*plVar17;
    }
    local_180._8_8_ = plVar17[1];
    *plVar17 = (long)psVar24;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (local_128->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
    errorInCaffeProto((string *)local_180,psVar5,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    uVar28 = local_98;
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  pWVar19 = (WeightParams *)((LVar18.activation_)->NonlinearityType_).relu_;
  if (pWVar19 == (WeightParams *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    ((LVar18.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar19;
  }
  if ((int)uVar31 < 0) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                  ,0x5d,
                  "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar19->floatvalue_;
  if (pRVar1->current_size_ < (int)uVar31) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar31);
    uVar36 = pRVar1->current_size_;
    if (uVar36 != uVar31) {
      memset(((pWVar19->floatvalue_).rep_)->elements + (int)uVar36,0,
             (ulong)uVar31 * 4 + (long)(int)uVar36 * -4);
    }
  }
  pRVar1->current_size_ = uVar31;
  local_70 = LVar18;
  if ((int)uVar28 != 0) {
    iVar10 = 0;
    iVar35 = 0;
    do {
      local_88 = (Type *)CONCAT44(local_88._4_4_,iVar10);
      uVar36 = (uint)local_e0;
      uVar27 = local_e0 & 0xffffffff;
      local_74 = iVar35;
      uVar28 = local_98;
      while (local_98 = uVar28, uVar36 != 0) {
        if (iVar10 < 0) {
          __assert_fail("index <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                        ,0x62,
                        "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        if (iVar35 < 0) {
          __assert_fail("dataIndex <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                        ,100,
                        "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        if ((local_90->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_180,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar15 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar15);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
        }
        pfVar20 = google::protobuf::RepeatedField<float>::Get
                            ((RepeatedField<float> *)
                             ((long)((local_90->blobs_).super_RepeatedPtrFieldBase.rep_)->elements
                                    [0] + 0x18),iVar35);
        local_1a0._M_dataplus._M_p._0_4_ = *pfVar20;
        google::protobuf::RepeatedField<float>::Set(pRVar1,iVar10,(float *)&local_1a0);
        iVar35 = iVar35 + (int)local_98;
        iVar10 = iVar10 + 1;
        uVar36 = (int)uVar27 - 1;
        uVar27 = (ulong)uVar36;
        uVar28 = local_98;
      }
      iVar35 = local_74 + 1;
      iVar10 = (int)local_88 + (int)local_e0;
    } while (iVar35 != (int)uVar28);
  }
  if (bVar3 == false) goto LAB_003d00b5;
  uVar36 = (uint)uVar28;
  if (((int)(uint)local_80 < 0) || (LVar18 = local_70, pTVar11 = local_90, (uint)local_80 != uVar36)
     ) {
    cVar9 = '\x01';
    if (9 < uVar36) {
      cVar8 = '\x04';
      do {
        cVar9 = cVar8;
        uVar31 = (uint)uVar28;
        if (uVar31 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_003cfbe9;
        }
        if (uVar31 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_003cfbe9;
        }
        if (uVar31 < 10000) goto LAB_003cfbe9;
        uVar28 = (uVar28 & 0xffffffff) / 10000;
        cVar8 = cVar9 + '\x04';
      } while (99999 < uVar31);
      cVar9 = cVar9 + '\x01';
    }
LAB_003cfbe9:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar36);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x5e4537);
    local_120 = &local_110;
    puVar23 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar23) {
      local_110 = *puVar23;
      lStack_108 = plVar17[3];
    }
    else {
      local_110 = *puVar23;
      local_120 = (ulong *)*plVar17;
    }
    local_118 = plVar17[1];
    *plVar17 = (long)puVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    puVar23 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar23) {
      local_138 = *puVar23;
      uStack_130 = puVar16[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *puVar23;
      local_148 = (ulong *)*puVar16;
    }
    local_140 = puVar16[1];
    *puVar16 = puVar23;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    uVar31 = (uint)local_80;
    uVar36 = -uVar31;
    if (0 < (int)uVar31) {
      uVar36 = uVar31;
    }
    uVar31 = 1;
    if (9 < uVar36) {
      uVar27 = (ulong)uVar36;
      uVar26 = 4;
      do {
        uVar31 = uVar26;
        uVar34 = (uint)uVar27;
        if (uVar34 < 100) {
          uVar31 = uVar31 - 2;
          goto LAB_003cfd40;
        }
        if (uVar34 < 1000) {
          uVar31 = uVar31 - 1;
          goto LAB_003cfd40;
        }
        if (uVar34 < 10000) goto LAB_003cfd40;
        uVar27 = uVar27 / 10000;
        uVar26 = uVar31 + 4;
      } while (99999 < uVar34);
      uVar31 = uVar31 + 1;
    }
LAB_003cfd40:
    uVar27 = local_80 >> 0x1f;
    local_100 = local_f0;
    std::__cxx11::string::_M_construct
              ((ulong)&local_100,(char)uVar31 - ((char)(local_80 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_100 + (uVar27 & 1)),uVar31,uVar36);
    uVar27 = CONCAT44(uStack_f4,local_f8) + local_140;
    uVar28 = 0xf;
    if (local_148 != &local_138) {
      uVar28 = local_138;
    }
    if (uVar28 < uVar27) {
      uVar28 = 0xf;
      if (local_100 != local_f0) {
        uVar28 = local_f0[0];
      }
      if (uVar28 < uVar27) goto LAB_003cfdcc;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_148);
    }
    else {
LAB_003cfdcc:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_100);
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    psVar24 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar24) {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0.field_2._8_8_ = puVar16[3];
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar24;
      local_1a0._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_1a0._M_string_length = puVar16[1];
    *puVar16 = psVar24;
    puVar16[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    psVar24 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar24) {
      local_180._16_8_ = *psVar24;
      local_180._24_4_ = (undefined4)plVar17[3];
      local_180._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_180._0_8_ = local_180 + 0x10;
    }
    else {
      local_180._16_8_ = *psVar24;
      local_180._0_8_ = (size_type *)*plVar17;
    }
    local_180._8_8_ = plVar17[1];
    *plVar17 = (long)psVar24;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (local_128->name_).ptr_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Inner Product","");
    errorInCaffeProto((string *)local_180,psVar5,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    uVar28 = local_98;
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    pTVar11 = local_90;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    LVar18 = local_70;
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  pWVar19 = (LVar18.innerproduct_)->bias_;
  if (pWVar19 == (WeightParams *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    (LVar18.innerproduct_)->bias_ = pWVar19;
  }
  iVar10 = (int)uVar28;
  if (iVar10 < 0) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                  ,0x71,
                  "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar1 = &pWVar19->floatvalue_;
  if (pRVar1->current_size_ < iVar10) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar10);
    iVar35 = pRVar1->current_size_;
    if (iVar35 != iVar10) {
      memset(((pWVar19->floatvalue_).rep_)->elements + iVar35,0,uVar28 * 4 + (long)iVar35 * -4);
    }
  }
  pRVar1->current_size_ = iVar10;
  if ((pTVar11->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_180);
  }
  lVar32 = *(long *)((pTVar11->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar32 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar10 = *(int *)(lVar32 + 0x18);
    if (iVar10 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar10);
      memcpy(((pWVar19->floatvalue_).rep_)->elements + (pWVar19->floatvalue_).current_size_,
             (void *)(*(long *)(lVar32 + 0x20) + 8),(long)*(int *)(lVar32 + 0x18) << 2);
      (pWVar19->floatvalue_).current_size_ =
           (pWVar19->floatvalue_).current_size_ + *(int *)(lVar32 + 0x18);
    }
  }
LAB_003d00b5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::EmbedParameter& caffeLayerParams = caffeLayer.embed_param();
    
    uint32_t inputChannels = caffeLayerParams.input_dim();
    uint32_t outputChannels = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), "Embed");
    }
    if (hasBias && caffeBiasLength == 0){
        CoreMLConverter::errorInCaffeProto("Expected bias parameters when 'bias_term' flag is set to True.", caffeLayer.name(), "Embed");
    }
    if (!hasBias && caffeBiasLength > 0) {
        CoreMLConverter::errorInCaffeProto("Found bias parameters even though 'bias_term' flag is False", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim_size() != 2){
        CoreMLConverter::errorInCaffeProto("Weight blob dim size is not 2", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(1) != outputChannels){
        CoreMLConverter::errorInCaffeProto("num_output("+std::to_string(outputChannels)+") does not match the second dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(1))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(0) != inputChannels){
        CoreMLConverter::errorInCaffeProto("input_dim("+std::to_string(inputChannels)+") does not match the first dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(0))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    //**************************************************************
    
    Specification::EmbeddingLayerParams* specLayerParams = specLayer->mutable_embedding();
    specLayerParams->set_inputdim(inputChannels);
    specLayerParams->set_outputchannels(outputChannels);
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights: need to transpose
    // Caffe embed weights are stored as [inputChannels,outputChannels]
    // CoreML needs in the format: [outputChannels,inputChannels]
    uint32_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights < 0 ||
        static_cast<uint32_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int>(blobSize), 0.0);
    for (uint32_t r=0; r<outputChannels; r++){
        for (uint32_t c=0; c<inputChannels; c++){
            uint32_t index = r*inputChannels+c;
            assert(index <= INT_MAX);
            uint32_t dataIndex = c*outputChannels+r;
            assert(dataIndex <= INT_MAX);
            weightsWrite->Set(static_cast<int>(index), caffeLayerWeights.blobs(0).data(static_cast<int>(dataIndex)));
        }
    }
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength < 0 ||
            static_cast<uint32_t>(caffeBiasLength) != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}